

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O1

void gz_uncompress(gzFile in,FILE *out)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  FILE *pFVar5;
  gzFile pgVar6;
  char *pcVar7;
  char *pcVar8;
  ulong unaff_RBP;
  char *pcVar9;
  char *pcVar10;
  FILE *__s;
  char *pcVar11;
  gzFile unaff_R12;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  bool bVar16;
  int err;
  char buf [16384];
  undefined4 uStack_48c0;
  undefined1 uStack_48bc;
  char *pcStack_48a8;
  gzFile pgStack_48a0;
  ulong uStack_4898;
  char *pcStack_4890;
  char *pcStack_4888;
  code *pcStack_4880;
  char acStack_4878 [1024];
  FILE *pFStack_4478;
  char acStack_4450 [1024];
  gzFile pgStack_4050;
  FILE *pFStack_4048;
  code *pcStack_4040;
  char local_402c [4];
  char local_4028 [16392];
  
  do {
    pcStack_4040 = (code *)0x101600;
    pcVar9 = local_4028;
    uVar1 = gzread(in,local_4028,0x4000);
    if ((int)uVar1 < 0) {
      pcVar9 = local_402c;
      pcStack_4040 = (code *)0x101656;
      __s = (FILE *)in;
      gz_uncompress_cold_4();
      goto LAB_00101656;
    }
    if (uVar1 == 0) goto LAB_00101623;
    unaff_RBP = (ulong)uVar1;
    pcVar9 = (char *)0x1;
    pcStack_4040 = (code *)0x10161a;
    sVar4 = fwrite(local_4028,1,(ulong)uVar1,(FILE *)out);
  } while (uVar1 == (uint)sVar4);
  pcStack_4040 = (code *)0x101623;
  gz_uncompress_cold_1();
LAB_00101623:
  pcStack_4040 = (code *)0x10162b;
  __s = out;
  iVar2 = fclose((FILE *)out);
  if (iVar2 == 0) {
    pcStack_4040 = (code *)0x101637;
    __s = (FILE *)in;
    iVar2 = gzclose();
    if (iVar2 == 0) {
      return;
    }
  }
  else {
LAB_00101656:
    pcStack_4040 = (code *)0x10165b;
    gz_uncompress_cold_2();
  }
  pcStack_4040 = file_compress;
  gz_uncompress_cold_3();
  pcVar8 = acStack_4450;
  pcVar10 = pcVar9;
  pgStack_4050 = in;
  pFStack_4048 = out;
  pcStack_4040 = (code *)local_4028;
  sVar4 = strlen((char *)__s);
  if (sVar4 - 0x3fd < 0xfffffffffffffc00) {
    file_compress_cold_3();
LAB_001016f1:
    file_compress_cold_2();
  }
  else {
    snprintf(acStack_4450,0x400,"%s%s",__s,".gz");
    pcVar10 = "rb";
    pFVar5 = fopen64((char *)__s,"rb");
    if (pFVar5 == (FILE *)0x0) goto LAB_001016f1;
    pcVar10 = pcVar9;
    pgVar6 = (gzFile)gzopen64(acStack_4450);
    if (pgVar6 != (gzFile)0x0) {
      gz_compress((FILE *)pFVar5,pgVar6);
      unlink((char *)__s);
      return;
    }
  }
  file_compress_cold_1();
  pcVar15 = acStack_4878;
  pcStack_4880 = (code *)0x101719;
  pFStack_4478 = __s;
  pcVar7 = (char *)strlen(pcVar8);
  uVar13 = (ulong)pcVar7 & 0xffffffff;
  if (uVar13 < 0x3fd) {
    unaff_R12 = (gzFile)0x400;
    pcStack_4880 = (code *)0x10174e;
    snprintf(acStack_4878,0x400,"%s",pcVar8);
    if ((uint)pcVar7 < 4) {
LAB_0010176c:
      unaff_R12 = (gzFile)(0x400 - uVar13);
      pcStack_4880 = (code *)0x10178b;
      snprintf(acStack_4878 + uVar13,(size_t)unaff_R12,"%s",".gz");
      pcVar9 = acStack_4878;
      pcVar15 = pcVar8;
    }
    else {
      pcStack_4880 = (code *)0x101768;
      iVar2 = strcmp(pcVar8 + (uVar13 - 3),".gz");
      if (iVar2 != 0) goto LAB_0010176c;
      acStack_4878[(uint)pcVar7 - 3] = '\0';
      pcVar9 = pcVar8;
    }
    pcVar10 = "rb";
    pcStack_4880 = (code *)0x10179d;
    pgVar6 = (gzFile)gzopen64(pcVar9);
    pcVar7 = pcVar15;
    if (pgVar6 == (gzFile)0x0) goto LAB_001017f3;
    pcVar10 = "wb";
    pcStack_4880 = (code *)0x1017b4;
    pFVar5 = fopen64(pcVar15,"wb");
    if (pFVar5 != (FILE *)0x0) {
      pcStack_4880 = (code *)0x1017c4;
      gz_uncompress(pgVar6,(FILE *)pFVar5);
      pcStack_4880 = (code *)0x1017cc;
      unlink(pcVar9);
      return;
    }
  }
  else {
    pcStack_4880 = (code *)0x1017f3;
    file_uncompress_cold_3();
LAB_001017f3:
    pgVar6 = unaff_R12;
    pcStack_4880 = (code *)0x1017fb;
    file_uncompress_cold_2();
  }
  pcStack_4880 = main;
  pcVar11 = pcVar8;
  file_uncompress_cold_1();
  uVar14 = (ulong)pcVar11 & 0xffffffff;
  uStack_48bc = 0;
  uStack_48c0 = 0x20366277;
  pcVar15 = *(char **)pcVar10;
  prog = pcVar15;
  pcStack_48a8 = pcVar8;
  pgStack_48a0 = pgVar6;
  uStack_4898 = uVar13;
  pcStack_4890 = pcVar9;
  pcStack_4888 = pcVar7;
  pcStack_4880 = (code *)unaff_RBP;
  pcVar8 = strrchr(pcVar15,0x2f);
  pcVar9 = pcVar8 + 1;
  if (pcVar8 == (char *)0x0) {
    pcVar9 = pcVar15;
  }
  iVar2 = strcmp(pcVar9,"gunzip");
  if (iVar2 == 0) {
    bVar16 = true;
    bVar12 = false;
  }
  else {
    iVar2 = strcmp(pcVar9,"zcat");
    bVar16 = iVar2 == 0;
    bVar12 = bVar16;
  }
  pcVar10 = pcVar10 + 8;
  iVar2 = (int)pcVar11 + -1;
  if (1 < (int)pcVar11) {
    do {
      pcVar9 = *(char **)pcVar10;
      iVar3 = strcmp(pcVar9,"-c");
      if (iVar3 == 0) {
        bVar12 = true;
      }
      else {
        iVar3 = strcmp(pcVar9,"-d");
        if (iVar3 == 0) {
          bVar16 = true;
        }
        else {
          iVar3 = strcmp(pcVar9,"-f");
          if (iVar3 == 0) {
            uStack_48c0 = CONCAT13(0x66,(undefined3)uStack_48c0);
          }
          else {
            iVar3 = strcmp(pcVar9,"-h");
            if (iVar3 == 0) {
              uStack_48c0 = CONCAT13(0x68,(undefined3)uStack_48c0);
            }
            else {
              iVar3 = strcmp(pcVar9,"-r");
              if (iVar3 == 0) {
                uStack_48c0 = CONCAT13(0x52,(undefined3)uStack_48c0);
              }
              else {
                if (*pcVar9 != '-') {
                  iVar2 = (int)uVar14 + -1;
                  goto LAB_0010195d;
                }
                if ((8 < (byte)(pcVar9[1] - 0x31U)) || (pcVar9[2] != '\0')) goto LAB_0010195d;
                uStack_48c0._0_3_ = CONCAT12(pcVar9[1],(undefined2)uStack_48c0);
              }
            }
          }
        }
      }
      pcVar10 = pcVar10 + 8;
      iVar2 = iVar2 + -1;
      uVar1 = (int)uVar14 - 1;
      uVar14 = (ulong)uVar1;
    } while (1 < (int)uVar1);
    iVar2 = 0;
  }
LAB_0010195d:
  if (uStack_48c0._3_1_ == ' ') {
    uStack_48c0 = uStack_48c0 & 0xffffff;
  }
  if (iVar2 == 0) {
    if (bVar16) {
      iVar2 = fileno(_stdin);
      pgVar6 = (gzFile)gzdopen(iVar2,"rb");
      if (pgVar6 == (gzFile)0x0) {
LAB_00101abc:
        main_cold_3();
LAB_00101ac1:
        main_cold_4();
        halt_baddata();
      }
      gz_uncompress(pgVar6,(FILE *)_stdout);
    }
    else {
      iVar2 = fileno(_stdout);
      pgVar6 = (gzFile)gzdopen(iVar2,&uStack_48c0);
      if (pgVar6 == (gzFile)0x0) goto LAB_00101ac1;
      gz_compress((FILE *)_stdin,pgVar6);
    }
  }
  else {
    do {
      pcVar9 = *(char **)pcVar10;
      if (bVar16) {
        if (bVar12) {
          pgVar6 = (gzFile)gzopen64(pcVar9,"rb");
          if (pgVar6 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar6,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar9);
        }
      }
      else if (bVar12) {
        pFVar5 = fopen64(pcVar9,"rb");
        if (pFVar5 == (FILE *)0x0) {
          perror(*(char **)pcVar10);
        }
        else {
          iVar3 = fileno(_stdout);
          pgVar6 = (gzFile)gzdopen(iVar3,&uStack_48c0);
          if (pgVar6 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101abc;
          }
          gz_compress((FILE *)pFVar5,pgVar6);
        }
      }
      else {
        file_compress(pcVar9,(char *)&uStack_48c0);
      }
      pcVar10 = pcVar10 + 8;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void gz_uncompress(in, out)
    gzFile in;
    FILE   *out;
{
    local char buf[BUFLEN];
    int len;
    int err;

    for (;;) {
        len = gzread(in, buf, sizeof(buf));
        if (len < 0) error (gzerror(in, &err));
        if (len == 0) break;

        if ((int)fwrite(buf, 1, (unsigned)len, out) != len) {
            error("failed fwrite");
        }
    }
    if (fclose(out)) error("failed fclose");

    if (gzclose(in) != Z_OK) error("failed gzclose");
}